

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ItaniumDemangle.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_18d51b::CtorVtableSpecialName::printLeft
          (CtorVtableSpecialName *this,OutputStream *S)

{
  StringView R;
  StringView R_00;
  
  R.Last = "";
  R.First = "construction vtable for ";
  OutputStream::operator+=(S,R);
  Node::print(this->FirstType,S);
  R_00.Last = "";
  R_00.First = "-in-";
  OutputStream::operator+=(S,R_00);
  Node::print(this->SecondType,S);
  return;
}

Assistant:

void printLeft(OutputStream &S) const override {
    S += "construction vtable for ";
    FirstType->print(S);
    S += "-in-";
    SecondType->print(S);
  }